

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

char * __thiscall mp::internal::BinaryReaderBase::Read(BinaryReaderBase *this,int length)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  local_20.field_1.values_ = (Value *)&local_38;
  pcVar2 = (this->super_ReaderBase).ptr_;
  pcVar1 = (this->super_ReaderBase).end_;
  if ((long)pcVar1 - (long)pcVar2 < (long)length) {
    (this->super_ReaderBase).token_ = pcVar1;
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    ReportError(this,(CStringRef)0x1727a5,&local_20);
    pcVar2 = (this->super_ReaderBase).ptr_;
  }
  (this->super_ReaderBase).ptr_ = pcVar2 + length;
  return pcVar2;
}

Assistant:

const char *Read(int length) {
    if (end_ - ptr_ < length) {
      token_ = end_;
      ReportError("unexpected end of file");
    }
    const char *start = ptr_;
    ptr_ += length;
    return start;
  }